

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtUnionFind.cpp
# Opt level: O2

void __thiscall cbtUnionFind::reset(cbtUnionFind *this,int N)

{
  cbtElement *pcVar1;
  ulong uVar2;
  
  allocate(this,N);
  pcVar1 = (this->m_elements).m_data;
  for (uVar2 = 0; (uint)(~(N >> 0x1f) & N) != uVar2; uVar2 = uVar2 + 1) {
    pcVar1[uVar2].m_id = (int)uVar2;
    pcVar1[uVar2].m_sz = 1;
  }
  return;
}

Assistant:

void cbtUnionFind::reset(int N)
{
	allocate(N);

	for (int i = 0; i < N; i++)
	{
		m_elements[i].m_id = i;
		m_elements[i].m_sz = 1;
	}
}